

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

string * __thiscall
MADPComponentFactoredStates::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentFactoredStates *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"SoftPrint()",(allocator<char> *)&local_1e0);
  AssureInitialized(this,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190,"- nr. states=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  SoftPrintStates_abi_cxx11_(&local_1e0,this);
  std::operator<<(local_190,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::operator<<(local_190,"Initial state distr.: ");
  SoftPrintInitialStateDistribution_abi_cxx11_(&local_1e0,this);
  std::operator<<(local_190,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::endl<char,std::char_traits<char>>(local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string MADPComponentFactoredStates::SoftPrint() const
{
    stringstream ss;
    AssureInitialized("SoftPrint()");
    ss << "- nr. states="<< GetNrStates()<<endl;
    ss << SoftPrintStates();
    ss << "Initial state distr.: ";
    ss << SoftPrintInitialStateDistribution();
    ss << endl;
    return(ss.str());
}